

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

vec3 dja::rotate(vec3 *r,vec3 *axis,float_t rad)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vec3 vVar14;
  
  fVar8 = cosf(rad);
  fVar9 = sinf(rad);
  fVar1 = axis->z;
  uVar2 = r->x;
  uVar5 = r->y;
  uVar3 = axis->x;
  uVar6 = axis->y;
  uVar4 = axis->y;
  uVar7 = axis->z;
  fVar11 = r->z * fVar1 + (float)uVar2 * (float)uVar3 + (float)uVar5 * (float)uVar6;
  fVar12 = (float)uVar2 - fVar11 * (float)uVar3;
  fVar13 = (float)uVar5 - fVar11 * (float)uVar6;
  fVar10 = r->z - fVar1 * fVar11;
  vVar14.z = (fVar10 * fVar8 - ((float)uVar6 * fVar12 - fVar13 * (float)uVar3) * fVar9) +
             fVar1 * fVar11;
  vVar14.y = (fVar8 * fVar13 - fVar9 * ((float)uVar3 * fVar10 - fVar12 * (float)uVar7)) +
             fVar11 * (float)uVar6;
  vVar14.x = (fVar8 * fVar12 - fVar9 * (fVar1 * fVar13 - fVar10 * (float)uVar4)) +
             fVar11 * (float)uVar3;
  return vVar14;
}

Assistant:

V3 rotate(const V3& r, const V3& axis, const V1 rad) {
    V1 c = cos(rad), s = sin(rad);
    V3 r1 = axis * dot(r, axis);
    V3 r2 = r - r1;
    V3 r3 = cross(r2, axis);

    return c * r2 - s * r3 + r1;
}